

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::sigmoid(tensor *dest,tensor *src)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t i;
  ulong uVar4;
  float fVar5;
  
  iVar2 = (*dest->_vptr_tensor[3])();
  iVar3 = (*src->_vptr_tensor[2])(src);
  uVar1 = src->m_size;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    fVar5 = expf(-*(float *)(CONCAT44(extraout_var_00,iVar3) + uVar4 * 4));
    *(float *)(CONCAT44(extraout_var,iVar2) + uVar4 * 4) = 1.0 / (fVar5 + 1.0);
  }
  return;
}

Assistant:

void sigmoid (
            tensor& dest,
            const tensor& src
        )
        {
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = 1/(1+std::exp(-s[i]));
        }